

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*>::~Stack
          (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*> *this)

{
  Node **ppNVar1;
  ulong uVar2;
  
  ppNVar1 = this->_stack;
  if (ppNVar1 != (Node **)0x0) {
    uVar2 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppNVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppNVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppNVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppNVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppNVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(ppNVar1,0x10);
      return;
    }
    *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppNVar1;
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }